

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.cc
# Opt level: O0

void __thiscall
bloaty::(anonymous_namespace)::ElfFile::StructReader::
ReadFallback<Elf32_Rela,Elf64_Rela,bloaty::(anonymous_namespace)::RelaMunger>
          (StructReader *this,uint64_t offset,string_view *range,Elf64_Rela *out)

{
  bool bVar1;
  undefined8 in_RCX;
  Elf64_Rela *in_RDX;
  string_view *in_RSI;
  undefined8 *in_RDI;
  StructReader *unaff_retaddr;
  anon_struct_12_3_62b0a826 data32;
  RelaMunger local_33 [2];
  RelaMunger local_31;
  undefined1 local_30 [15];
  RelaMunger local_21;
  undefined8 local_20;
  undefined8 *offset_00;
  
  local_20 = in_RCX;
  offset_00 = in_RDI;
  bVar1 = anon_unknown_0::ElfFile::is_64bit((ElfFile *)*in_RDI);
  if (bVar1) {
    bVar1 = anon_unknown_0::ElfFile::is_native_endian((ElfFile *)*in_RDI);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      __assert_fail("!elf_.is_native_endian()",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/elf.cc",
                    0x15a,
                    "void bloaty::(anonymous namespace)::ElfFile::StructReader::ReadFallback(uint64_t, std::string_view *, T64 *) const [T32 = Elf32_Rela, T64 = Elf64_Rela, Munger = bloaty::(anonymous namespace)::RelaMunger]"
                   );
    }
    anon_unknown_0::ElfFile::StructReader::Memcpy<Elf64_Rela>
              (unaff_retaddr,(uint64_t)offset_00,in_RSI,in_RDX);
    RelaMunger::operator()(&local_21,local_20,local_20);
  }
  else {
    anon_unknown_0::ElfFile::StructReader::Memcpy<Elf32_Rela>
              (unaff_retaddr,(uint64_t)offset_00,in_RSI,(anon_struct_12_3_62b0a826 *)in_RDX);
    bVar1 = anon_unknown_0::ElfFile::is_native_endian((ElfFile *)*in_RDI);
    if (bVar1) {
      RelaMunger::operator()(&local_31,local_30,local_20);
    }
    else {
      RelaMunger::operator()(local_33,local_30,local_20);
    }
  }
  return;
}

Assistant:

void ElfFile::StructReader::ReadFallback(uint64_t offset,
                                         std::string_view* range,
                                         T64* out) const {
  // Fallback for either 32-bit ELF file or non-native endian.
  if (elf_.is_64bit()) {
    assert(!elf_.is_native_endian());
    Memcpy(offset, range, out);
    Munger()(*out, out, ByteSwapFunc());
  } else {
    T32 data32;
    Memcpy(offset, range, &data32);
    if (elf_.is_native_endian()) {
      Munger()(data32, out, NullFunc());
    } else {
      Munger()(data32, out, ByteSwapFunc());
    }
  }
}